

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O1

bool __thiscall ConvexBuilder::combineHulls(ConvexBuilder *this)

{
  ChUllVector *this_00;
  ChUll **ptr;
  ChUll *pCVar1;
  ChUll *pCVar2;
  ChUll *pCVar3;
  ChUll *pCVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ChUll *this_01;
  bool bVar10;
  bool bVar11;
  ChUllVector output;
  cbtAlignedObjectArray<ChUll_*> local_68;
  ChUll *local_48;
  cbtAlignedObjectArray<ChUll_*> *local_40;
  long local_38;
  
  this_00 = &this->mChulls;
  iVar6 = (this->mChulls).m_size;
  this_01 = (ChUll *)this;
  if (1 < iVar6) {
    this_01 = (ChUll *)this_00;
    cbtAlignedObjectArray<ChUll_*>::quickSortInternal<ChUllSort>
              (this_00,(ChUllSort *)&local_68,0,iVar6 + -1);
  }
  local_68.m_ownsMemory = true;
  uVar8 = 0;
  local_68.m_data = (ChUll **)0x0;
  local_68.m_size = 0;
  local_68.m_capacity = 0;
  local_40 = this_00;
  if ((this->mChulls).m_size < 1) {
    bVar10 = false;
  }
  else {
    bVar10 = false;
    while( true ) {
      iVar6 = (int)uVar8;
      pCVar2 = (ChUll *)(this->mChulls).m_data[iVar6];
      if (0 < (this->mChulls).m_size) {
        lVar5 = 0;
        local_48 = pCVar2;
        do {
          pCVar4 = (ChUll *)(this->mChulls).m_data[lVar5];
          local_38 = lVar5;
          if (pCVar2 == pCVar4) {
            bVar11 = true;
          }
          else {
            pCVar1 = canMerge((ConvexBuilder *)this_01,(ChUll *)pCVar2,(ChUll *)pCVar4);
            bVar11 = pCVar1 == (ChUll *)0x0;
            pCVar2 = local_48;
            if (!bVar11) {
              if (local_68.m_size == local_68.m_capacity) {
                iVar6 = local_68.m_size * 2;
                if (local_68.m_size == 0) {
                  iVar6 = 1;
                }
                if (local_68.m_capacity < iVar6) {
                  if (iVar6 == 0) {
                    pCVar2 = (ChUll *)0x0;
                  }
                  else {
                    pCVar2 = (ChUll *)cbtAlignedAllocInternal((long)iVar6 << 3,0x10);
                  }
                  if (0 < (long)local_68.m_size) {
                    lVar5 = 0;
                    do {
                      *(undefined8 *)(pCVar2->mMin + lVar5 * 2 + -1) =
                           *(undefined8 *)((HaF32 *)((long)local_68.m_data + 4) + lVar5 * 2 + -1);
                      lVar5 = lVar5 + 1;
                    } while (local_68.m_size != lVar5);
                  }
                  if (((ChUll *)local_68.m_data != (ChUll *)0x0) && (local_68.m_ownsMemory == true))
                  {
                    cbtAlignedFreeInternal(local_68.m_data);
                  }
                  local_68.m_ownsMemory = true;
                  this_01 = (ChUll *)local_68.m_data;
                  local_68.m_data = (ChUll **)pCVar2;
                  local_68.m_capacity = iVar6;
                }
              }
              *(ChUll **)((HaF32 *)((long)local_68.m_data + 4) + (long)local_68.m_size * 2 + -1) =
                   pCVar1;
              local_68.m_size = local_68.m_size + 1;
              uVar7 = (int)uVar8 + 1;
              uVar8 = (ulong)uVar7;
              if (uVar7 != (this->mChulls).m_size) {
                uVar8 = (ulong)(int)uVar7;
                do {
                  pCVar2 = (ChUll *)(this->mChulls).m_data[uVar8];
                  if (pCVar2 != pCVar4) {
                    if (local_68.m_size == local_68.m_capacity) {
                      iVar6 = local_68.m_size * 2;
                      if (local_68.m_size == 0) {
                        iVar6 = 1;
                      }
                      if (local_68.m_capacity < iVar6) {
                        if (iVar6 == 0) {
                          pCVar3 = (ChUll *)0x0;
                        }
                        else {
                          pCVar3 = (ChUll *)cbtAlignedAllocInternal((long)iVar6 << 3,0x10);
                        }
                        if (0 < (long)local_68.m_size) {
                          lVar5 = 0;
                          do {
                            *(undefined8 *)(pCVar3->mMin + lVar5 * 2 + -1) =
                                 *(undefined8 *)
                                  ((HaF32 *)((long)local_68.m_data + 4) + lVar5 * 2 + -1);
                            lVar5 = lVar5 + 1;
                          } while (local_68.m_size != lVar5);
                        }
                        if (((ChUll *)local_68.m_data != (ChUll *)0x0) &&
                           (local_68.m_ownsMemory == true)) {
                          cbtAlignedFreeInternal(local_68.m_data);
                        }
                        local_68.m_ownsMemory = true;
                        this_01 = (ChUll *)local_68.m_data;
                        local_68.m_data = (ChUll **)pCVar3;
                        local_68.m_capacity = iVar6;
                      }
                    }
                    *(ChUll **)
                     ((HaF32 *)((long)local_68.m_data + 4) + (long)local_68.m_size * 2 + -1) =
                         pCVar2;
                    local_68.m_size = local_68.m_size + 1;
                  }
                  uVar8 = uVar8 + 1;
                } while ((this->mChulls).m_size != (int)uVar8);
              }
              pCVar2 = local_48;
              if (local_48 != (ChUll *)0x0) {
                ChUll::~ChUll(local_48);
                this_01 = pCVar2;
                operator_delete(pCVar2,0x28);
              }
              bVar10 = true;
              if (pCVar4 != (ChUll *)0x0) {
                ChUll::~ChUll(pCVar4);
                operator_delete(pCVar4,0x28);
                this_01 = pCVar4;
              }
            }
          }
          iVar6 = (int)uVar8;
        } while ((bVar11) && (lVar5 = local_38 + 1, lVar5 < (this->mChulls).m_size));
      }
      if (bVar10) break;
      if (local_68.m_size == local_68.m_capacity) {
        iVar9 = local_68.m_size * 2;
        if (local_68.m_size == 0) {
          iVar9 = 1;
        }
        if (local_68.m_capacity < iVar9) {
          if (iVar9 == 0) {
            pCVar4 = (ChUll *)0x0;
          }
          else {
            pCVar4 = (ChUll *)cbtAlignedAllocInternal((long)iVar9 << 3,0x10);
          }
          if (0 < (long)local_68.m_size) {
            lVar5 = 0;
            do {
              *(undefined8 *)(pCVar4->mMin + lVar5 * 2 + -1) =
                   *(undefined8 *)((HaF32 *)((long)local_68.m_data + 4) + lVar5 * 2 + -1);
              lVar5 = lVar5 + 1;
            } while (local_68.m_size != lVar5);
          }
          if (((ChUll *)local_68.m_data != (ChUll *)0x0) && (local_68.m_ownsMemory == true)) {
            cbtAlignedFreeInternal(local_68.m_data);
          }
          local_68.m_ownsMemory = true;
          this_01 = (ChUll *)local_68.m_data;
          local_68.m_data = (ChUll **)pCVar4;
          local_68.m_capacity = iVar9;
        }
      }
      *(ChUll **)((HaF32 *)((long)local_68.m_data + 4) + (long)local_68.m_size * 2 + -1) = pCVar2;
      local_68.m_size = local_68.m_size + 1;
      if ((bVar10 != false) ||
         (uVar8 = (ulong)(iVar6 + 1U), (this->mChulls).m_size <= (int)(iVar6 + 1U))) break;
    }
  }
  if (bVar10 != false) {
    ptr = (this->mChulls).m_data;
    if (ptr != (ChUll **)0x0) {
      if ((this->mChulls).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->mChulls).m_data = (ChUll **)0x0;
    }
    (this->mChulls).m_ownsMemory = true;
    (this->mChulls).m_data = (ChUll **)0x0;
    (this->mChulls).m_size = 0;
    (this->mChulls).m_capacity = 0;
    cbtAlignedObjectArray<ChUll_*>::copyFromArray(local_40,&local_68);
    if (((ChUll *)local_68.m_data != (ChUll *)0x0) && (local_68.m_ownsMemory == true)) {
      cbtAlignedFreeInternal(local_68.m_data);
    }
    local_68.m_ownsMemory = true;
    local_68.m_data = (ChUll **)0x0;
    local_68.m_size = 0;
    local_68.m_capacity = 0;
  }
  cbtAlignedObjectArray<ChUll_*>::~cbtAlignedObjectArray(&local_68);
  return bVar10;
}

Assistant:

bool ConvexBuilder::combineHulls(void)
{

	bool combine = false;

	sortChulls(mChulls); // sort the convex hulls, largest volume to least...

	ChUllVector output; // the output hulls...


	int i;

	for (i=0;i<mChulls.size() && !combine; ++i)
	{
		ChUll *cr = mChulls[i];

		int j;
		for (j=0;j<mChulls.size();j++)
		{
			ChUll *match = mChulls[j];

			if ( cr != match ) // don't try to merge a hull with itself, that be stupid
			{

				ChUll *merge = canMerge(cr,match); // if we can merge these two....

				if ( merge )
				{

					output.push_back(merge);


					++i;
					while ( i != mChulls.size() )
					{
						ChUll *cr = mChulls[i];
						if ( cr != match )
						{
							output.push_back(cr);
						}
						i++;
					}

					delete cr;
					delete match;
					combine = true;
					break;
				}
			}
		}

		if ( combine )
		{
			break;
		}
		else
		{
			output.push_back(cr);
		}

	}

	if ( combine )
	{
		mChulls.clear();
		mChulls = output;
		output.clear();
	}


	return combine;
}